

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFileOptions
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  long lVar1;
  string *element_name;
  bool bVar2;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  Type *proto_03;
  long lVar3;
  int i;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(file + 0x48); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(file + 0x50);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateMessageOptions(this,(Descriptor *)(lVar1 + lVar3),proto_00);
    lVar3 = lVar3 + 0x78;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(file + 0x58); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(file + 0x60);
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateEnumOptions(this,(EnumDescriptor *)(lVar1 + lVar3),proto_01);
    lVar3 = lVar3 + 0x38;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(file + 0x68); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(file + 0x70);
    proto_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                         (&(proto->service_).super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateServiceOptions(this,(ServiceDescriptor *)(lVar1 + lVar3),proto_02);
    lVar3 = lVar3 + 0x30;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(file + 0x78); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(file + 0x80);
    proto_03 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateFieldOptions(this,(FieldDescriptor *)(lVar1 + lVar3),proto_03);
    lVar3 = lVar3 + 0x78;
  }
  bVar2 = IsLite(file);
  if (!bVar2) {
    lVar3 = 0;
    do {
      if (*(int *)(file + 0x18) <= lVar3) {
        return;
      }
      bVar2 = IsLite(*(FileDescriptor **)(*(long *)(file + 0x20) + lVar3 * 8));
      lVar3 = lVar3 + 1;
    } while (!bVar2);
    element_name = *(string **)file;
    std::operator+(&local_50,
                   "Files that do not use optimize_for = LITE_RUNTIME cannot import files which do use this option.  This file is not lite, but it imports \""
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    **(undefined8 **)(*(long *)(file + 0x20) + -8 + lVar3 * 8));
    std::operator+(&local_70,&local_50,"\" which is.");
    AddError(this,element_name,&proto->super_Message,OTHER,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFileOptions(FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(file, message_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(file, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(file, service, Service);
  VALIDATE_OPTIONS_FROM_ARRAY(file, extension, Field);

  // Lite files can only be imported by other Lite files.
  if (!IsLite(file)) {
    for (int i = 0; i < file->dependency_count(); i++) {
      if (IsLite(file->dependency(i))) {
        AddError(
          file->name(), proto,
          DescriptorPool::ErrorCollector::OTHER,
          "Files that do not use optimize_for = LITE_RUNTIME cannot import "
          "files which do use this option.  This file is not lite, but it "
          "imports \"" + file->dependency(i)->name() + "\" which is.");
        break;
      }
    }
  }
}